

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if.h
# Opt level: O3

word * If_CutTruthW(If_Man_t *p,If_Cut_t *pCut)

{
  uint uVar1;
  word *pwVar2;
  Vec_Mem_t *pVVar3;
  uint uVar4;
  word *pwVar5;
  ulong uVar6;
  
  uVar1 = pCut->iCutFunc;
  if ((int)uVar1 < 0) {
    __assert_fail("pCut->iCutFunc >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                  ,0x1b8,"word *If_CutTruthW(If_Man_t *, If_Cut_t *)");
  }
  pwVar2 = p->puTempW;
  pVVar3 = p->vTtMem[(byte)pCut->field_0x1f];
  if (pVVar3 == (Vec_Mem_t *)0x0) {
    pwVar5 = (word *)0x0;
  }
  else {
    uVar4 = uVar1 >> 1;
    if (pVVar3->nEntries <= (int)uVar4) {
      __assert_fail("i >= 0 && i < p->nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                    ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
    }
    pwVar5 = pVVar3->ppPages[uVar4 >> ((byte)pVVar3->LogPageSze & 0x1f)] +
             (ulong)(uVar4 & pVVar3->PageMask) * (long)pVVar3->nEntrySize;
  }
  uVar4 = p->nTruth6Words[(byte)pCut->field_0x1f];
  if ((uVar1 & 1) == 0) {
    if (0 < (int)uVar4) {
      uVar6 = 0;
      do {
        pwVar2[uVar6] = pwVar5[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
    }
  }
  else if (0 < (int)uVar4) {
    uVar6 = 0;
    do {
      pwVar2[uVar6] = ~pwVar5[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  return pwVar2;
}

Assistant:

static inline word *     If_CutTruthW( If_Man_t * p, If_Cut_t * pCut )       { assert( pCut->iCutFunc >= 0 ); Abc_TtCopy( p->puTempW, If_CutTruthWR(p, pCut), p->nTruth6Words[pCut->nLeaves], If_CutTruthIsCompl(pCut) ); return p->puTempW;  }